

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_psbt.cpp
# Opt level: O0

void __thiscall Psbt_SetTxOutOnly_Test::Psbt_SetTxOutOnly_Test(Psbt_SetTxOutOnly_Test *this)

{
  Test *in_RDI;
  
  testing::Test::Test(in_RDI);
  in_RDI->_vptr_Test = (_func_int **)&PTR__Psbt_SetTxOutOnly_Test_009f0708;
  return;
}

Assistant:

TEST(Psbt, SetTxOutOnly) {
  Psbt psbt;
  EXPECT_EQ(0, psbt.GetTxOutCount());
  
  HDWallet wallet1 = HDWallet(ByteData(g_psbt_seed1));
  HDWallet wallet2 = HDWallet(ByteData(g_psbt_seed2));
  std::string path1 = "44h/0h/0h/0/2";
  std::string path2 = "44h/0h/0h/0/2";
  auto key1 = wallet1.GeneratePubkeyData(NetType::kTestnet, path1);
  auto key2 = wallet2.GeneratePubkeyData(NetType::kTestnet, path2);
  auto addr1 = Address(NetType::kTestnet, WitnessVersion::kVersion0, key1.GetPubkey());
  auto addr2 = Address(NetType::kTestnet, WitnessVersion::kVersion0, key2.GetPubkey());

  Amount amount(100000000);
  TxOut txout_1(amount, addr1);
  TxOut txout_2(amount, addr2);
  TxOutReference txout_2r(txout_2);
  psbt.AddTxOut(txout_1);
  psbt.AddTxOut(txout_2r);
  EXPECT_EQ(2, psbt.GetTxOutCount());

  EXPECT_STREQ("70736274ff01004802000000000200e1f50500000000160014b322bddce633b851ac7370ab454f0b367a0654e500e1f50500000000160014cab8c53a6e8fc0296d1cd3915a307d51c491a55500000000000000", psbt.GetData().GetHex().c_str());
  Psbt psbt2(psbt.GetData());
  EXPECT_STREQ("cHNidP8BAEgCAAAAAAIA4fUFAAAAABYAFLMivdzmM7hRrHNwq0VPCzZ6BlTlAOH1BQAAAAAWABTKuMU6bo/AKW0c05FaMH1RxJGlVQAAAAAAAAA=", psbt2.GetBase64().c_str());
}